

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionRequest.c
# Opt level: O0

int UpnpActionRequest_assign(UpnpActionRequest *p,UpnpActionRequest *q)

{
  int iVar1;
  UpnpString *pUVar2;
  IXML_Document *pIVar3;
  sockaddr_storage *buf;
  bool bVar4;
  bool bVar5;
  undefined1 local_b9;
  undefined4 local_1c;
  int ok;
  UpnpActionRequest *q_local;
  UpnpActionRequest *p_local;
  
  local_1c = 1;
  if (p != q) {
    iVar1 = UpnpActionRequest_get_ErrCode(q);
    iVar1 = UpnpActionRequest_set_ErrCode(p,iVar1);
    bVar4 = false;
    if (iVar1 != 0) {
      iVar1 = UpnpActionRequest_get_Socket(q);
      iVar1 = UpnpActionRequest_set_Socket(p,iVar1);
      bVar4 = iVar1 != 0;
    }
    bVar5 = false;
    if (bVar4) {
      pUVar2 = UpnpActionRequest_get_ErrStr(q);
      iVar1 = UpnpActionRequest_set_ErrStr(p,pUVar2);
      bVar5 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar5) {
      pUVar2 = UpnpActionRequest_get_ActionName(q);
      iVar1 = UpnpActionRequest_set_ActionName(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar5 = false;
    if (bVar4) {
      pUVar2 = UpnpActionRequest_get_DevUDN(q);
      iVar1 = UpnpActionRequest_set_DevUDN(p,pUVar2);
      bVar5 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar5) {
      pUVar2 = UpnpActionRequest_get_ServiceID(q);
      iVar1 = UpnpActionRequest_set_ServiceID(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    bVar5 = false;
    if (bVar4) {
      pIVar3 = UpnpActionRequest_get_ActionRequest(q);
      iVar1 = UpnpActionRequest_set_ActionRequest(p,pIVar3);
      bVar5 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar5) {
      pIVar3 = UpnpActionRequest_get_ActionResult(q);
      iVar1 = UpnpActionRequest_set_ActionResult(p,pIVar3);
      bVar4 = iVar1 != 0;
    }
    bVar5 = false;
    if (bVar4) {
      pIVar3 = UpnpActionRequest_get_SoapHeader(q);
      iVar1 = UpnpActionRequest_set_SoapHeader(p,pIVar3);
      bVar5 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar5) {
      buf = UpnpActionRequest_get_CtrlPtIPAddr(q);
      iVar1 = UpnpActionRequest_set_CtrlPtIPAddr(p,buf);
      bVar4 = iVar1 != 0;
    }
    local_b9 = false;
    if (bVar4) {
      pUVar2 = UpnpActionRequest_get_Os(q);
      iVar1 = UpnpActionRequest_set_Os(p,pUVar2);
      local_b9 = iVar1 != 0;
    }
    local_1c = (uint)local_b9;
  }
  return local_1c;
}

Assistant:

int UpnpActionRequest_assign(UpnpActionRequest *p, const UpnpActionRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionRequest_set_ErrCode(
				   p, UpnpActionRequest_get_ErrCode(q));
		ok = ok && UpnpActionRequest_set_Socket(
				   p, UpnpActionRequest_get_Socket(q));
		ok = ok && UpnpActionRequest_set_ErrStr(
				   p, UpnpActionRequest_get_ErrStr(q));
		ok = ok && UpnpActionRequest_set_ActionName(
				   p, UpnpActionRequest_get_ActionName(q));
		ok = ok && UpnpActionRequest_set_DevUDN(
				   p, UpnpActionRequest_get_DevUDN(q));
		ok = ok && UpnpActionRequest_set_ServiceID(
				   p, UpnpActionRequest_get_ServiceID(q));
		ok = ok && UpnpActionRequest_set_ActionRequest(
				   p, UpnpActionRequest_get_ActionRequest(q));
		ok = ok && UpnpActionRequest_set_ActionResult(
				   p, UpnpActionRequest_get_ActionResult(q));
		ok = ok && UpnpActionRequest_set_SoapHeader(
				   p, UpnpActionRequest_get_SoapHeader(q));
		ok = ok && UpnpActionRequest_set_CtrlPtIPAddr(
				   p, UpnpActionRequest_get_CtrlPtIPAddr(q));
		ok = ok &&
		     UpnpActionRequest_set_Os(p, UpnpActionRequest_get_Os(q));
	}

	return ok;
}